

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

timestamp_t __thiscall DigitalConsumer::getData(DigitalConsumer *this,int16_t *dest)

{
  pointer puVar1;
  uint *puVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  undefined4 extraout_var;
  int64_t iVar6;
  ulong uVar7;
  timestamp_t tVar8;
  
  puVar1 = (this->temp_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar5 = (*(this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub[5])
                    (this,puVar1,
                     (long)(this->temp_buffer).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar1);
  if (CONCAT44(extraout_var,iVar5) == 0) {
    uVar7 = 0;
    iVar6 = 0;
  }
  else {
    puVar2 = (uint *)(this->temp_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (uVar7 = 0; uVar7 < (ulong)((long)piVar4 - (long)piVar3 >> 2); uVar7 = uVar7 + 2) {
      *(ushort *)((long)dest + uVar7) =
           (ushort)((*(byte *)((long)puVar2 + (long)piVar3[uVar7] + 4) >>
                     (piVar3[uVar7 + 1] & 0x1fU) & 1) != 0);
    }
    uVar7 = (ulong)*puVar2;
    iVar6 = (this->super_HFSubConsumer).lasttimestamp;
  }
  tVar8.system_timestamp = iVar6;
  tVar8._0_8_ = uVar7;
  return tVar8;
}

Assistant:

timestamp_t DigitalConsumer::getData(int16_t *dest){
    if(!readData(temp_buffer.data(), temp_buffer.size())){
        return {0,0};
    }
    byte *src = temp_buffer.data() + sizeof(uint32_t); // start of digital data is after timestamp
    int offset = 0;
    for(size_t i = 0; i < args.indices.size(); i += 2){
        const int byt = args.indices[i];
        const int bit = args.indices[i+1];
        //Unlike the rest, digital data is one bit at a time. May be a waste, but we are converting
        //the 0/1's to int16_t numbers for convenience
        //1<<bit creates mask for bit position, & operation to isolate that bit,
        //shift the bit to the first position to get 0 or 1, store it at the second byte of a int16_t num
        dest[offset] = (int16_t)((src[byt] & (1 << bit)) >> bit); //Convert to 2byte int
        ++offset;
    }
    return {*(uint32_t*)(temp_buffer.data()), lastSysTimestamp()}; //Timestamp at beginning of packet
}